

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

optional<pbrt::LightBounds> * __thiscall
pbrt::DiffuseAreaLight::Bounds
          (optional<pbrt::LightBounds> *__return_storage_ptr__,DiffuseAreaLight *this)

{
  undefined8 uVar1;
  bool bVar2;
  uint uVar3;
  float *__result;
  Tuple2<pbrt::Point2,_int> TVar4;
  float *pfVar5;
  long lVar6;
  float *pfVar7;
  int c;
  int c_00;
  Curve *this_00;
  Point2i p;
  ulong uVar8;
  Float FVar9;
  float fVar10;
  undefined1 auVar11 [64];
  undefined1 auVar12 [16];
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 local_78 [12];
  Float FStack_6c;
  bool local_68;
  optional<pbrt::LightBounds> *local_60;
  long local_58;
  ulong local_50;
  Bounds3f local_48;
  
  if (((this->image).resolution.super_Tuple2<pbrt::Point2,_int>.x < 1) ||
     ((this->image).resolution.super_Tuple2<pbrt::Point2,_int>.y < 1)) {
    pfVar5 = (this->Lemit).values.ptr;
    uVar8 = (this->Lemit).values.nStored;
    if (1 < uVar8) {
      auVar11 = ZEXT464((uint)*pfVar5);
      lVar6 = uVar8 * 4 + -4;
      pfVar7 = pfVar5;
      do {
        pfVar7 = pfVar7 + 1;
        fVar10 = auVar11._0_4_;
        auVar14 = vmaxss_avx(ZEXT416((uint)*pfVar7),auVar11._0_16_);
        auVar11 = ZEXT1664(auVar14);
        if (fVar10 < *pfVar7) {
          pfVar5 = pfVar7;
        }
        lVar6 = lVar6 + -4;
      } while (lVar6 != 0);
    }
    fVar10 = *pfVar5;
  }
  else {
    TVar4 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
    if (TVar4.y < 1) {
      fVar10 = 0.0;
    }
    else {
      fVar10 = 0.0;
      lVar6 = 0;
      local_60 = __return_storage_ptr__;
      do {
        local_58 = lVar6;
        if (0 < TVar4.x) {
          local_50 = lVar6 << 0x20;
          uVar8 = 0;
          do {
            c_00 = 0;
            p.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(local_50 | uVar8);
            do {
              FVar9 = Image::GetChannel(&this->image,p,c_00,(WrapMode2D)0x200000002);
              c_00 = c_00 + 1;
              fVar10 = fVar10 + FVar9;
            } while (c_00 != 3);
            TVar4 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
            uVar8 = uVar8 + 1;
          } while ((long)uVar8 < (long)TVar4.x);
        }
        lVar6 = local_58 + 1;
        __return_storage_ptr__ = local_60;
      } while (lVar6 < (long)TVar4 >> 0x20);
    }
    fVar10 = fVar10 / (float)(TVar4.x * TVar4.y * 3);
  }
  uVar8 = (this->shape).
          super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
          .bits;
  local_60 = (optional<pbrt::LightBounds> *)CONCAT44(local_60._4_4_,(uint)this->twoSided);
  local_50 = CONCAT44(local_50._4_4_,this->scale);
  local_58 = CONCAT44(local_58._4_4_,this->area);
  uVar3 = (uint)(ushort)(uVar8 >> 0x30);
  if (uVar8 >> 0x32 == 0) {
    if ((0x1ffffffffffff < uVar8) && (uVar3 != 2)) {
      Disk::NormalBounds((Disk *)(uVar8 & 0xffffffffffff));
      goto LAB_002d9365;
    }
  }
  else {
    uVar3 = uVar3 - 3;
    if (uVar3 < 2) {
      Triangle::NormalBounds((DirectionCone *)local_78,(Triangle *)(uVar8 & 0xffffffffffff));
      goto LAB_002d9365;
    }
    if (uVar3 == 2) {
      BilinearPatch::NormalBounds
                ((DirectionCone *)local_78,(BilinearPatch *)(uVar8 & 0xffffffffffff));
      goto LAB_002d9365;
    }
  }
  _local_78 = vmovhps_avx(ZEXT816(0) << 0x40,0xbf8000003f800000);
  local_68 = false;
LAB_002d9365:
  uVar8 = (this->shape).
          super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
          .bits;
  uVar3 = (uint)(ushort)(uVar8 >> 0x30);
  if (uVar8 < 0x4000000000000) {
    if (uVar8 < 0x2000000000000) {
      Sphere::Bounds(&local_48,(Sphere *)(uVar8 & 0xffffffffffff));
    }
    else if (uVar3 == 2) {
      Cylinder::Bounds(&local_48,(Cylinder *)(uVar8 & 0xffffffffffff));
    }
    else {
      Disk::Bounds(&local_48,(Disk *)(uVar8 & 0xffffffffffff));
    }
  }
  else {
    uVar3 = uVar3 - 3;
    this_00 = (Curve *)(uVar8 & 0xffffffffffff);
    if (uVar3 < 2) {
      Triangle::Bounds(&local_48,(Triangle *)this_00);
    }
    else if (uVar3 == 2) {
      BilinearPatch::Bounds(&local_48,(BilinearPatch *)this_00);
    }
    else {
      Curve::Bounds(&local_48,this_00);
    }
  }
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_78._0_8_;
  bVar2 = this->twoSided;
  __return_storage_ptr__->set = true;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) =
       local_48.pMax.super_Tuple3<pbrt::Point3,_float>._4_8_;
  auVar14._0_4_ = local_78._0_4_ * local_78._0_4_;
  auVar14._4_4_ = local_78._4_4_ * local_78._4_4_;
  auVar14._8_8_ = 0;
  auVar14 = vhaddps_avx(auVar14,auVar14);
  auVar14 = ZEXT416((uint)(auVar14._0_4_ + (float)local_78._8_4_ * (float)local_78._8_4_));
  auVar14 = vsqrtss_avx(auVar14,auVar14);
  fVar13 = auVar14._0_4_;
  auVar15._4_4_ = fVar13;
  auVar15._0_4_ = fVar13;
  auVar15._8_4_ = fVar13;
  auVar15._12_4_ = fVar13;
  auVar14 = vdivps_avx(auVar12,auVar15);
  *(undefined8 *)&__return_storage_ptr__->optionalValue =
       local_48.pMin.super_Tuple3<pbrt::Point3,_float>._0_8_;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = local_48._8_8_;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x18) =
       (float)((uint)((byte)local_60 & 1) * 0x40000000 +
              (uint)!(bool)((byte)local_60 & 1) * 0x3f800000) * (float)local_50 * (float)local_58 *
       3.1415927 * fVar10;
  uVar1 = vmovlps_avx(auVar14);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = uVar1;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x24) = (float)local_78._8_4_ / fVar13;
  *(Float *)((long)&__return_storage_ptr__->optionalValue + 0x28) = FStack_6c;
  *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x2c) = 0xb33bbd2e;
  (__return_storage_ptr__->optionalValue).__data[0x30] = bVar2;
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<LightBounds> DiffuseAreaLight::Bounds() const {
    // Compute _phi_ for diffuse area light bounds
    Float phi = 0;
    if (image) {
        // Compute average _DiffuseAreaLight_ image channel value
        // Assume no distortion in the mapping, FWIW...
        for (int y = 0; y < image.Resolution().y; ++y)
            for (int x = 0; x < image.Resolution().x; ++x)
                for (int c = 0; c < 3; ++c)
                    phi += image.GetChannel({x, y}, c);
        phi /= 3 * image.Resolution().x * image.Resolution().y;

    } else
        phi = Lemit.MaxValue();
    phi *= scale * (twoSided ? 2 : 1) * area * Pi;

    DirectionCone nb = shape.NormalBounds();
    return LightBounds(shape.Bounds(), nb.w, phi, nb.cosTheta, std::cos(Pi / 2),
                       twoSided);
}